

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_tag.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::UnionTagBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  string_t data;
  anon_struct_16_3_d7536bce_for_pointer aVar1;
  bool bVar2;
  LogicalTypeId LVar3;
  pointer pEVar4;
  undefined8 uVar5;
  size_type sVar6;
  string *psVar7;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  anon_struct_16_3_d7536bce_for_pointer aVar8;
  LogicalType enum_type;
  string_t str;
  idx_t i;
  Vector varchar_vector;
  idx_t member_count;
  string *in_stack_fffffffffffffda8;
  LogicalType *in_stack_fffffffffffffdb0;
  Vector *pVVar9;
  LogicalType *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  undefined7 uVar10;
  LogicalTypeId in_stack_fffffffffffffdcf;
  undefined1 uVar11;
  LogicalType *in_stack_fffffffffffffdd0;
  idx_t capacity;
  LogicalType *type_p;
  ParameterNotResolvedException *in_stack_fffffffffffffdf0;
  undefined8 local_170;
  char *pcStack_168;
  ulong local_160;
  Vector local_158;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  idx_t local_b0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  
  local_20 = in_RCX;
  bVar2 = std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  if (bVar2) {
    local_55 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_40,"Missing required arguments for union_tag function.",&local_41);
    BinderException::BinderException
              ((BinderException *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_55 = 0;
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffdb0);
  LVar3 = LogicalType::id(&pEVar4->return_type);
  if (LVar3 == UNKNOWN) {
    uVar5 = __cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(in_stack_fffffffffffffdf0);
    __cxa_throw(uVar5,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffdb0);
  LVar3 = LogicalType::id(&pEVar4->return_type);
  if (LVar3 != UNION) {
    local_7a = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_78,"First argument to union_tag function must be a union type.",&local_79);
    BinderException::BinderException
              ((BinderException *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_7a = 0;
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  sVar6 = ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::size(local_20);
  if (1 < sVar6) {
    local_a2 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_a0,"Too many arguments, union_tag takes at most one argument.",&local_a1);
    BinderException::BinderException
              ((BinderException *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_a2 = 0;
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffdb0);
  local_b0 = UnionType::GetMemberCount((LogicalType *)0x21a02f0);
  if (local_b0 == 0) {
    local_d2 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_d0,"Can\'t get tags from an empty union",&local_d1);
    InternalException::InternalException
              ((InternalException *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_d2 = 0;
    __cxa_throw(uVar5,&InternalException::typeinfo,InternalException::~InternalException);
  }
  capacity = 0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffdb0);
  type_p = &pEVar4->return_type;
  vector<duckdb::LogicalType,_true>::operator[]
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffdb0,
             (size_type)in_stack_fffffffffffffda8);
  LogicalType::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  pVVar9 = &local_158;
  LogicalType::LogicalType(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcf);
  Vector::Vector(pVVar9,type_p,capacity);
  LogicalType::~LogicalType((LogicalType *)0x21a046d);
  aVar8.ptr = (char *)in_stack_fffffffffffffdb0;
  aVar8._0_8_ = in_stack_fffffffffffffdb8;
  for (local_160 = 0; local_160 < local_b0; local_160 = local_160 + 1) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)aVar8.ptr,(size_type)in_stack_fffffffffffffda8);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)aVar8.ptr);
    psVar7 = UnionType::GetMemberName_abi_cxx11_
                       ((LogicalType *)aVar8.ptr,(idx_t)in_stack_fffffffffffffda8);
    uVar10 = SUB87(psVar7,0);
    uVar11 = (undefined1)((ulong)psVar7 >> 0x38);
    string_t::string_t((string_t *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                       aVar8._0_8_);
    in_stack_fffffffffffffdc7 = string_t::IsInlined((string_t *)0x21a04f6);
    if ((bool)in_stack_fffffffffffffdc7) {
      aVar1.ptr = pcStack_168;
      aVar1._0_8_ = local_170;
    }
    else {
      data.value.pointer.prefix[3] = uVar11;
      data.value._0_7_ = uVar10;
      data.value.pointer.ptr = (char *)pEVar4;
      aVar8 = (anon_struct_16_3_d7536bce_for_pointer)
              StringVector::AddString
                        ((Vector *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                         data);
      aVar1 = aVar8;
    }
    in_stack_fffffffffffffda8 = (string *)FlatVector::GetData<duckdb::string_t>((Vector *)0x21a0588)
    ;
    *(anon_struct_16_3_d7536bce_for_pointer *)
     ((anon_union_16_2_67f50693_for_value *)&in_stack_fffffffffffffda8->_M_dataplus + local_160) =
         aVar1;
  }
  LogicalType::ENUM(aVar8._0_8_,(idx_t)aVar8.ptr);
  LogicalType::operator=(aVar8._0_8_,(LogicalType *)aVar8.ptr);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             aVar8.ptr,in_stack_fffffffffffffda8);
  pVVar9 = (Vector *)aVar8.ptr;
  LogicalType::~LogicalType((LogicalType *)0x21a0673);
  Vector::~Vector(pVVar9);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> UnionTagBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {

	if (arguments.empty()) {
		throw BinderException("Missing required arguments for union_tag function.");
	}

	if (LogicalTypeId::UNKNOWN == arguments[0]->return_type.id()) {
		throw ParameterNotResolvedException();
	}

	if (LogicalTypeId::UNION != arguments[0]->return_type.id()) {
		throw BinderException("First argument to union_tag function must be a union type.");
	}

	if (arguments.size() > 1) {
		throw BinderException("Too many arguments, union_tag takes at most one argument.");
	}

	auto member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (member_count == 0) {
		// this should never happen, empty unions are not allowed
		throw InternalException("Can't get tags from an empty union");
	}

	bound_function.arguments[0] = arguments[0]->return_type;

	auto varchar_vector = Vector(LogicalType::VARCHAR, member_count);
	for (idx_t i = 0; i < member_count; i++) {
		auto str = string_t(UnionType::GetMemberName(arguments[0]->return_type, i));
		FlatVector::GetData<string_t>(varchar_vector)[i] =
		    str.IsInlined() ? str : StringVector::AddString(varchar_vector, str);
	}
	auto enum_type = LogicalType::ENUM(varchar_vector, member_count);
	bound_function.return_type = enum_type;

	return nullptr;
}